

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  long lVar1;
  uint64_t seq;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t content_type_local;
  uint8_t aad [5];
  
  lVar1 = inlen + 1 + ctx->aead->algo->tag_size;
  aad[0] = '\x17';
  aad[1] = '\x03';
  aad[2] = '\x03';
  aad[3] = (uint8_t)((ulong)lVar1 >> 8);
  aad[4] = (uint8_t)lVar1;
  seq = ctx->seq;
  ctx->seq = seq + 1;
  content_type_local = content_type;
  ptls_aead_encrypt_init(ctx->aead,seq,aad,5);
  sVar2 = (*ctx->aead->do_encrypt_update)(ctx->aead,output,input,inlen);
  sVar3 = (*ctx->aead->do_encrypt_update)
                    (ctx->aead,(void *)((long)output + sVar2),&content_type_local,1);
  sVar4 = (*ctx->aead->do_encrypt_final)(ctx->aead,(void *)((long)output + sVar3 + sVar2));
  return sVar4 + sVar3 + sVar2;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}